

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O0

void __thiscall
google::protobuf::internal::InternalMetadata::
DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(InternalMetadata *this)

{
  Container<google::protobuf::UnknownFieldSet> *this_00;
  InternalMetadata *this_local;
  
  this_00 = PtrValue<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                      (this);
  if (this_00 != (Container<google::protobuf::UnknownFieldSet> *)0x0) {
    Container<google::protobuf::UnknownFieldSet>::~Container(this_00);
    operator_delete(this_00,0x18);
  }
  this->ptr_ = 0;
  return;
}

Assistant:

PROTOBUF_NOINLINE void DeleteOutOfLineHelper() {
    delete PtrValue<Container<T>>();
    // TODO:  This store is load-bearing.  Since we are destructing
    // the message at this point, see if we can eliminate it.
    ptr_ = 0;
  }